

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_set_arrow(EditLine *el,wchar_t *name,keymacro_value_t *fun,wchar_t type)

{
  funckey_t *pfVar1;
  int iVar2;
  int local_3c;
  wchar_t i;
  funckey_t *arrow;
  wchar_t type_local;
  keymacro_value_t *fun_local;
  wchar_t *name_local;
  EditLine *el_local;
  
  pfVar1 = (el->el_terminal).t_fkey;
  local_3c = 0;
  while( true ) {
    if (6 < local_3c) {
      return L'\xffffffff';
    }
    iVar2 = wcscmp(name,pfVar1[local_3c].name);
    if (iVar2 == 0) break;
    local_3c = local_3c + 1;
  }
  pfVar1[local_3c].fun = *fun;
  pfVar1[local_3c].type = type;
  return L'\0';
}

Assistant:

libedit_private int
terminal_set_arrow(EditLine *el, const wchar_t *name, keymacro_value_t *fun,
    int type)
{
	funckey_t *arrow = el->el_terminal.t_fkey;
	int i;

	for (i = 0; i < A_K_NKEYS; i++)
		if (wcscmp(name, arrow[i].name) == 0) {
			arrow[i].fun = *fun;
			arrow[i].type = type;
			return 0;
		}
	return -1;
}